

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

int __thiscall zmq::msg_t::init_buffer(msg_t *this,void *buf_,size_t size_)

{
  int iVar1;
  void *__dest;
  size_t in_RDX;
  void *in_RSI;
  size_t in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  iVar1 = init_size((msg_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    if (in_RDX != 0) {
      __dest = data((msg_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      memcpy(__dest,in_RSI,in_RDX);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::msg_t::init_buffer (const void *buf_, size_t size_)
{
    const int rc = init_size (size_);
    if (unlikely (rc < 0)) {
        return -1;
    }
    if (size_) {
        // NULL and zero size is allowed
        assert (NULL != buf_);
        memcpy (data (), buf_, size_);
    }
    return 0;
}